

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O0

bool Qentem::Digit::parseExponent<char16_t>
               (char16_t *content,SizeT32 *exponent,bool *is_negative_exp,SizeT *offset,
               SizeT end_offset)

{
  char16_t cVar1;
  SizeT SVar2;
  bool bVar3;
  char16_t digit;
  SizeT o_offset;
  bool sign_set;
  SizeT end_offset_local;
  SizeT *offset_local;
  bool *is_negative_exp_local;
  SizeT32 *exponent_local;
  char16_t *content_local;
  
  bVar3 = false;
  do {
    if (end_offset <= *offset) {
      return false;
    }
    if (content[*offset] == L'+') {
      if (bVar3) {
        return false;
      }
      *offset = *offset + 1;
    }
    else {
      if (content[*offset] != L'-') {
        SVar2 = *offset;
        while (((*offset < end_offset && (cVar1 = content[*offset], 0x2f < (ushort)cVar1)) &&
               ((ushort)cVar1 < 0x3a))) {
          *exponent = *exponent * 10;
          *exponent = ((ushort)cVar1 - 0x30) + *exponent;
          *offset = *offset + 1;
        }
        return SVar2 != *offset;
      }
      if (bVar3) {
        return false;
      }
      *offset = *offset + 1;
      *is_negative_exp = true;
    }
    bVar3 = true;
  } while( true );
}

Assistant:

static bool parseExponent(const Char_T *content, SizeT32 &exponent, bool &is_negative_exp, SizeT &offset,
                              const SizeT end_offset) noexcept {
        bool sign_set{false};

        while (offset < end_offset) {
            switch (content[offset]) {
                case DigitUtils::DigitChar::Positive: {
                    if (!sign_set) {
                        ++offset;
                        sign_set = true;
                        break;
                    }

                    return false;
                }
                case DigitUtils::DigitChar::Negative: {
                    if (!sign_set) {
                        ++offset;
                        is_negative_exp = true;
                        sign_set        = true;
                        break;
                    }

                    return false;
                }

                default: {
                    const SizeT o_offset = offset;

                    while (offset < end_offset) {
                        const Char_T digit = content[offset];

                        if ((digit >= DigitUtils::DigitChar::Zero) && (digit <= DigitUtils::DigitChar::Nine)) {
                            exponent *= SizeT32{10};
                            exponent += SizeT32(digit - DigitUtils::DigitChar::Zero);
                            ++offset;
                            continue;
                        }

                        break;
                    }

                    return (o_offset != offset);
                }
            }
        }

        return false;
    }